

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_hom.cxx
# Opt level: O1

void __thiscall xray_re::xr_level_hom::load(xr_level_hom *this,xr_reader *r)

{
  undefined8 *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  size_t sVar7;
  hom_poly *phVar8;
  ulong uVar9;
  uint32_t version;
  int local_2c;
  
  sVar7 = xr_reader::r_raw_chunk(r,0,&local_2c,4);
  if (sVar7 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                  ,0x10,"void xray_re::xr_level_hom::load(xr_reader &)");
  }
  if (local_2c == 0) {
    sVar7 = xr_reader::find_chunk(r,1);
    if (sVar7 != 0) {
      uVar3 = (sVar7 / 0x28) * 0x28;
      if (sVar7 == uVar3) {
        phVar8 = (hom_poly *)operator_new__(uVar3);
        this->m_polys = phVar8;
        if (0x27 < sVar7) {
          uVar9 = 0;
          puVar2 = (r->field_2).m_p;
          do {
            *(undefined8 *)((long)&phVar8->field_0 + uVar9 + 0x20) = *(undefined8 *)(puVar2 + 0x20);
            uVar4 = *(undefined8 *)puVar2;
            uVar5 = *(undefined8 *)(puVar2 + 8);
            uVar6 = *(undefined8 *)(puVar2 + 0x18);
            puVar1 = (undefined8 *)((long)&phVar8->field_0 + uVar9 + 0x10);
            *puVar1 = *(undefined8 *)(puVar2 + 0x10);
            puVar1[1] = uVar6;
            puVar1 = (undefined8 *)((long)&phVar8->field_0 + uVar9);
            *puVar1 = uVar4;
            puVar1[1] = uVar5;
            (r->field_2).m_p = puVar2 + 0x28;
            uVar9 = uVar9 + 0x28;
            puVar2 = puVar2 + 0x28;
          } while (uVar3 != uVar9);
        }
        this->m_num_polys = (uint32_t)(sVar7 / 0x28);
        return;
      }
    }
    __assert_fail("size && (size % sizeof(hom_poly) == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                  ,0x13,"void xray_re::xr_level_hom::load(xr_reader &)");
  }
  __assert_fail("version == HOM_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_hom.cxx"
                ,0x11,"void xray_re::xr_level_hom::load(xr_reader &)");
}

Assistant:

void xr_level_hom::load(xr_reader& r)
{
	uint32_t version;
	if (!r.r_chunk(HOM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == HOM_VERSION);
	size_t size = r.find_chunk(HOM_CHUNK_POLYGONS);
	xr_assert(size && (size % sizeof(hom_poly) == 0));
	m_polys = new hom_poly[size /= sizeof(hom_poly)];
	r.r_cseq(size, m_polys);
	m_num_polys = uint32_t(size & UINT32_MAX);
}